

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  byte bVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  int iVar24;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  
  uVar10 = this->num_digits_;
  uVar11 = (ulong)uVar10;
  uVar12 = this->exp_;
  uVar13 = (ulong)uVar12;
  uVar8 = uVar12 + uVar10;
  if ((this->specs_).field_0x4 == '\x01') {
    pcVar18 = this->digits_;
    *it = (int)*pcVar18;
    uVar12 = (this->specs_).precision - uVar10;
    bVar16 = (byte)(*(uint *)&(this->specs_).field_0x4 >> 0x15) & 1 & 0 < (int)uVar12;
    if (((int)uVar10 < 2) && (bVar16 == 0)) {
      pwVar6 = it + 1;
    }
    else {
      pwVar6 = it + 2;
      it[1] = this->decimal_point_;
      if (1 < (int)uVar10) {
        do {
          pcVar18 = pcVar18 + 1;
          uVar11 = uVar11 - 1;
          *pwVar6 = (int)*pcVar18;
          pwVar6 = pwVar6 + 1;
        } while (1 < uVar11);
      }
    }
    auVar5 = _DAT_00207170;
    auVar4 = _DAT_00204580;
    auVar3 = _DAT_001fe020;
    pwVar7 = pwVar6;
    if (bVar16 != 0) {
      pwVar7 = pwVar6 + uVar12;
      uVar11 = (ulong)uVar12 + 0x3fffffffffffffff;
      uVar13 = uVar11 & 0x3fffffffffffffff;
      auVar21._8_4_ = (int)uVar13;
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = (int)(uVar13 >> 0x20);
      lVar14 = 0;
      auVar21 = auVar21 ^ _DAT_001fe020;
      do {
        auVar26._8_4_ = (int)lVar14;
        auVar26._0_8_ = lVar14;
        auVar26._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar30 = (auVar26 | auVar4) ^ auVar3;
        iVar24 = auVar21._4_4_;
        if ((bool)(~(auVar30._4_4_ == iVar24 && auVar21._0_4_ < auVar30._0_4_ ||
                    iVar24 < auVar30._4_4_) & 1)) {
          pwVar6[lVar14] = L'0';
        }
        if ((auVar30._12_4_ != auVar21._12_4_ || auVar30._8_4_ <= auVar21._8_4_) &&
            auVar30._12_4_ <= auVar21._12_4_) {
          pwVar6[lVar14 + 1] = L'0';
        }
        auVar26 = (auVar26 | auVar5) ^ auVar3;
        iVar31 = auVar26._4_4_;
        if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar26._0_4_ <= auVar21._0_4_)) {
          pwVar6[lVar14 + 2] = L'0';
          pwVar6[lVar14 + 3] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
    }
    *pwVar7 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pwVar6 = write_exponent<wchar_t,wchar_t*>(uVar8 - 1,pwVar7 + 1);
    return pwVar6;
  }
  if ((int)uVar12 < 0) {
    if ((int)uVar8 < 1) {
      *it = L'0';
      uVar9 = -uVar8;
      uVar12 = (this->specs_).precision;
      uVar2 = uVar9;
      if (SBORROW4(uVar12,uVar9) != (int)(uVar12 + uVar8) < 0) {
        uVar2 = uVar12;
      }
      if ((int)uVar12 < 0) {
        uVar2 = uVar9;
      }
      if (0 < (int)uVar10 && ((this->specs_).field_0x6 & 0x20) == 0) {
        do {
          uVar10 = (uint)uVar11;
          if (this->digits_[uVar11 - 1] != '0') goto LAB_001c7d6b;
          uVar11 = (ulong)(uVar10 - 1);
        } while (1 < (int)uVar10);
        uVar10 = 0;
      }
      if (uVar2 == 0 && uVar10 == 0) {
        pwVar7 = it + 1;
      }
      else {
LAB_001c7d6b:
        pwVar7 = it + 2;
        it[1] = this->decimal_point_;
        auVar5 = _DAT_00207170;
        auVar4 = _DAT_00204580;
        auVar3 = _DAT_001fe020;
        if (0 < (int)uVar2) {
          pwVar7 = pwVar7 + uVar2;
          uVar11 = (ulong)uVar2 + 0x3fffffffffffffff;
          uVar13 = uVar11 & 0x3fffffffffffffff;
          auVar23._8_4_ = (int)uVar13;
          auVar23._0_8_ = uVar13;
          auVar23._12_4_ = (int)(uVar13 >> 0x20);
          lVar14 = 0;
          auVar23 = auVar23 ^ _DAT_001fe020;
          do {
            auVar28._8_4_ = (int)lVar14;
            auVar28._0_8_ = lVar14;
            auVar28._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar21 = (auVar28 | auVar4) ^ auVar3;
            iVar24 = auVar23._4_4_;
            if ((bool)(~(auVar21._4_4_ == iVar24 && auVar23._0_4_ < auVar21._0_4_ ||
                        iVar24 < auVar21._4_4_) & 1)) {
              it[lVar14 + 2] = L'0';
            }
            if ((auVar21._12_4_ != auVar23._12_4_ || auVar21._8_4_ <= auVar23._8_4_) &&
                auVar21._12_4_ <= auVar23._12_4_) {
              it[lVar14 + 3] = L'0';
            }
            auVar21 = (auVar28 | auVar5) ^ auVar3;
            iVar31 = auVar21._4_4_;
            if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar21._0_4_ <= auVar23._0_4_)) {
              it[lVar14 + 4] = L'0';
              it[lVar14 + 5] = L'0';
            }
            lVar14 = lVar14 + 4;
          } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
        }
        if (0 < (int)uVar10) {
          pcVar18 = this->digits_;
          uVar11 = (ulong)uVar10 + 1;
          do {
            *pwVar7 = (int)*pcVar18;
            pcVar18 = pcVar18 + 1;
            pwVar7 = pwVar7 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
      }
    }
    else {
      lVar17 = (long)(int)uVar10;
      pcVar18 = this->digits_;
      uVar13 = (ulong)uVar8;
      uVar11 = uVar13 + 1;
      lVar19 = 0;
      lVar14 = 0;
      do {
        it[lVar19] = (int)pcVar18[lVar19];
        uVar11 = uVar11 - 1;
        lVar14 = lVar14 + -4;
        lVar19 = lVar19 + 1;
      } while (1 < uVar11);
      pcVar15 = pcVar18 + uVar13;
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        lVar1 = -lVar14;
        uVar12 = uVar10 - 1;
        if ((int)uVar8 < (int)(uVar10 - 1)) {
          uVar12 = uVar8;
        }
        do {
          if (pcVar18[lVar17 + -1] != '0') {
            uVar12 = (uint)lVar17;
            break;
          }
          lVar17 = lVar17 + -1;
        } while ((long)uVar13 < lVar17);
        if (uVar12 != uVar8) {
          lVar1 = 4 - lVar14;
          it[lVar19] = this->decimal_point_;
        }
        pwVar7 = (wchar_t *)((long)it + lVar1);
        lVar14 = (long)(int)uVar12 - uVar13;
        if (lVar14 != 0 && (long)uVar13 <= (long)(int)uVar12) {
          uVar11 = lVar14 + 1;
          do {
            *pwVar7 = (int)*pcVar15;
            pcVar15 = pcVar15 + 1;
            pwVar7 = pwVar7 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
      }
      else {
        pwVar6 = (wchar_t *)((long)it + (4 - lVar14));
        it[lVar19] = this->decimal_point_;
        if (lVar17 - uVar13 != 0 && (long)uVar13 <= lVar17) {
          uVar11 = (lVar17 - uVar13) + 1;
          do {
            *pwVar6 = (int)*pcVar15;
            pcVar15 = pcVar15 + 1;
            pwVar6 = pwVar6 + 1;
            uVar11 = uVar11 - 1;
          } while (1 < uVar11);
        }
        auVar5 = _DAT_00207170;
        auVar4 = _DAT_00204580;
        auVar3 = _DAT_001fe020;
        iVar24 = (this->specs_).precision;
        uVar12 = iVar24 - uVar10;
        pwVar7 = pwVar6;
        if ((uVar12 != 0 && (int)uVar10 <= iVar24) && (uVar12 != 0 && (int)uVar10 <= iVar24)) {
          uVar11 = (ulong)uVar12 + 0x3fffffffffffffff;
          uVar13 = uVar11 & 0x3fffffffffffffff;
          auVar30._8_4_ = (int)uVar13;
          auVar30._0_8_ = uVar13;
          auVar30._12_4_ = (int)(uVar13 >> 0x20);
          lVar14 = 0;
          auVar30 = auVar30 ^ _DAT_001fe020;
          do {
            auVar29._8_4_ = (int)lVar14;
            auVar29._0_8_ = lVar14;
            auVar29._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar21 = (auVar29 | auVar4) ^ auVar3;
            iVar24 = auVar30._4_4_;
            if ((bool)(~(auVar21._4_4_ == iVar24 && auVar30._0_4_ < auVar21._0_4_ ||
                        iVar24 < auVar21._4_4_) & 1)) {
              pwVar6[lVar14] = L'0';
            }
            if ((auVar21._12_4_ != auVar30._12_4_ || auVar21._8_4_ <= auVar30._8_4_) &&
                auVar21._12_4_ <= auVar30._12_4_) {
              pwVar6[lVar14 + 1] = L'0';
            }
            auVar21 = (auVar29 | auVar5) ^ auVar3;
            iVar31 = auVar21._4_4_;
            if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar21._0_4_ <= auVar30._0_4_)) {
              pwVar6[lVar14 + 2] = L'0';
              pwVar6[lVar14 + 3] = L'0';
            }
            lVar14 = lVar14 + 4;
            pwVar7 = pwVar6 + uVar12;
          } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
        }
      }
    }
  }
  else {
    if (0 < (int)uVar10) {
      pcVar18 = this->digits_;
      uVar11 = uVar11 + 1;
      do {
        *it = (int)*pcVar18;
        pcVar18 = pcVar18 + 1;
        it = it + 1;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
    auVar5 = _DAT_00207170;
    auVar4 = _DAT_00204580;
    auVar3 = _DAT_001fe020;
    pwVar6 = it;
    if (uVar13 != 0) {
      pwVar6 = it + uVar13;
      uVar11 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
      auVar20._8_4_ = (int)uVar11;
      auVar20._0_8_ = uVar11;
      auVar20._12_4_ = (int)(uVar11 >> 0x20);
      lVar14 = 0;
      auVar20 = auVar20 ^ _DAT_001fe020;
      do {
        auVar25._8_4_ = (int)lVar14;
        auVar25._0_8_ = lVar14;
        auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar21 = (auVar25 | auVar4) ^ auVar3;
        iVar24 = auVar20._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar24 && auVar20._0_4_ < auVar21._0_4_ ||
                    iVar24 < auVar21._4_4_) & 1)) {
          it[lVar14] = L'0';
        }
        if ((auVar21._12_4_ != auVar20._12_4_ || auVar21._8_4_ <= auVar20._8_4_) &&
            auVar21._12_4_ <= auVar20._12_4_) {
          it[lVar14 + 1] = L'0';
        }
        auVar21 = (auVar25 | auVar5) ^ auVar3;
        iVar31 = auVar21._4_4_;
        if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar21._0_4_ <= auVar20._0_4_)) {
          it[lVar14 + 2] = L'0';
          it[lVar14 + 3] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar11 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar14);
    }
    pwVar7 = pwVar6;
    if (((this->specs_).field_0x6 & 0x20) != 0) {
      *pwVar6 = this->decimal_point_;
      auVar5 = _DAT_00207170;
      auVar4 = _DAT_00204580;
      auVar3 = _DAT_001fe020;
      iVar24 = (this->specs_).precision;
      uVar10 = iVar24 - uVar8;
      if (uVar10 == 0 || iVar24 < (int)uVar8) {
        pwVar7 = pwVar6 + 1;
        if ((this->specs_).field_0x4 != '\x02') {
          pwVar6[1] = L'0';
          pwVar7 = pwVar6 + 2;
        }
      }
      else {
        uVar11 = (ulong)uVar10 + 0x3fffffffffffffff;
        uVar13 = uVar11 & 0x3fffffffffffffff;
        auVar22._8_4_ = (int)uVar13;
        auVar22._0_8_ = uVar13;
        auVar22._12_4_ = (int)(uVar13 >> 0x20);
        lVar14 = 0;
        auVar22 = auVar22 ^ _DAT_001fe020;
        do {
          auVar27._8_4_ = (int)lVar14;
          auVar27._0_8_ = lVar14;
          auVar27._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar21 = (auVar27 | auVar4) ^ auVar3;
          iVar24 = auVar22._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar24 && auVar22._0_4_ < auVar21._0_4_ ||
                      iVar24 < auVar21._4_4_) & 1)) {
            pwVar6[lVar14 + 1] = L'0';
          }
          if ((auVar21._12_4_ != auVar22._12_4_ || auVar21._8_4_ <= auVar22._8_4_) &&
              auVar21._12_4_ <= auVar22._12_4_) {
            pwVar6[lVar14 + 2] = L'0';
          }
          auVar21 = (auVar27 | auVar5) ^ auVar3;
          iVar31 = auVar21._4_4_;
          if (iVar31 <= iVar24 && (iVar31 != iVar24 || auVar21._0_4_ <= auVar22._0_4_)) {
            pwVar6[lVar14 + 3] = L'0';
            pwVar6[lVar14 + 4] = L'0';
          }
          lVar14 = lVar14 + 4;
          pwVar7 = pwVar6 + 1 + uVar10;
        } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
      }
    }
  }
  return pwVar7;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }